

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

void __thiscall
slang::ast::SequenceRepetition::serializeTo(SequenceRepetition *this,ASTSerializer *serializer)

{
  Kind KVar1;
  size_t __n;
  
  ASTSerializer::startObject(serializer);
  KVar1 = this->kind;
  if (KVar1 == GoTo) {
    __n = 4;
  }
  else if (KVar1 == Nonconsecutive) {
    __n = 0xe;
  }
  else {
    if (KVar1 != Consecutive) goto LAB_004b1795;
    __n = 0xb;
  }
  ASTSerializer::write(serializer,4,"kind",__n);
LAB_004b1795:
  SequenceRange::serializeTo(&this->range,serializer);
  ASTSerializer::endObject(serializer);
  return;
}

Assistant:

void SequenceRepetition::serializeTo(ASTSerializer& serializer) const {
    serializer.startObject();

    switch (kind) {
        case Consecutive:
            serializer.write("kind", "Consecutive"sv);
            break;
        case Nonconsecutive:
            serializer.write("kind", "Nonconsecutive"sv);
            break;
        case GoTo:
            serializer.write("kind", "GoTo"sv);
            break;
    }

    range.serializeTo(serializer);
    serializer.endObject();
}